

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceAccessChain
          (ScalarReplacementPass *this,Instruction *chain,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  Op op;
  pointer ppIVar1;
  IRContext *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  DefUseManager *pDVar7;
  Instruction *pIVar8;
  ConstantManager *this_00;
  Constant *this_01;
  int64_t iVar9;
  Instruction *this_02;
  Operand *pOVar10;
  BasicBlock *block;
  uint32_t i;
  initializer_list<unsigned_int> init_list;
  iterator chainIter;
  uint32_t local_a4;
  iterator iter;
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uVar4 = Instruction::GetSingleWordInOperand(chain,1);
  pDVar7 = Pass::get_def_use_mgr((Pass *)this);
  pIVar8 = analysis::DefUseManager::GetDef(pDVar7,uVar4);
  this_00 = IRContext::get_constant_mgr((this->super_MemPass).super_Pass.context_);
  this_01 = analysis::ConstantManager::GetConstantFromInst(this_00,pIVar8);
  iVar9 = analysis::Constant::GetSignExtendedValue(this_01);
  if ((iVar9 < 0) ||
     (ppIVar1 = (replacements->
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
     (long)(replacements->
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           )._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1 >> 3 <= iVar9)) {
LAB_0048c9f3:
    bVar3 = false;
  }
  else {
    pIVar8 = ppIVar1[iVar9];
    uVar4 = Instruction::NumInOperands(chain);
    if (uVar4 < 3) {
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      uVar4 = Instruction::result_id(chain);
      uVar5 = Instruction::result_id(pIVar8);
      IRContext::ReplaceAllUsesWith(pIVar2,uVar4,uVar5);
    }
    else {
      chainIter.super_iterator.node_ = (iterator)(iterator)chain;
      uVar4 = Pass::TakeNextId((Pass *)this);
      if (uVar4 == 0) goto LAB_0048c9f3;
      this_02 = (Instruction *)::operator_new(0x70);
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      op = chain->opcode_;
      uVar5 = Instruction::type_id(chain);
      local_a4 = Instruction::result_id(pIVar8);
      init_list._M_len = 1;
      init_list._M_array = &local_a4;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
      iter.super_iterator.node_._0_4_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,&local_70);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 (Operand *)&iter,&local_70);
      Instruction::Instruction(this_02,pIVar2,op,uVar5,uVar4,(OperandList *)&local_48);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_48);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
      uVar5 = 2;
      while( true ) {
        uVar6 = Instruction::NumInOperands(chain);
        if (uVar6 <= uVar5) break;
        pOVar10 = Instruction::GetInOperand(chain,uVar5);
        Operand::Operand((Operand *)&iter,pOVar10);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&this_02->operands_,(Operand *)&iter);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
        uVar5 = uVar5 + 1;
      }
      Instruction::UpdateDebugInfoFrom(this_02,chain);
      InstructionList::iterator::InsertBefore
                (&iter,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        *)&chainIter);
      pDVar7 = Pass::get_def_use_mgr((Pass *)this);
      analysis::DefUseManager::AnalyzeInstDefUse
                (pDVar7,(Instruction *)
                        CONCAT44(iter.super_iterator.node_._4_4_,iter.super_iterator.node_._0_4_));
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      pIVar8 = (Instruction *)
               CONCAT44(iter.super_iterator.node_._4_4_,iter.super_iterator.node_._0_4_);
      block = IRContext::get_instr_block(pIVar2,chain);
      IRContext::set_instr_block(pIVar2,pIVar8,block);
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      uVar5 = Instruction::result_id(chain);
      IRContext::ReplaceAllUsesWith(pIVar2,uVar5,uVar4);
      if (this_02 != (Instruction *)0x0) {
        (*(this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
                  ();
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ScalarReplacementPass::ReplaceAccessChain(
    Instruction* chain, const std::vector<Instruction*>& replacements) {
  // Replaces the access chain with either another access chain (with one fewer
  // indexes) or a direct use of the replacement variable.
  uint32_t indexId = chain->GetSingleWordInOperand(1u);
  const Instruction* index = get_def_use_mgr()->GetDef(indexId);
  int64_t indexValue = context()
                           ->get_constant_mgr()
                           ->GetConstantFromInst(index)
                           ->GetSignExtendedValue();
  if (indexValue < 0 ||
      indexValue >= static_cast<int64_t>(replacements.size())) {
    // Out of bounds access, this is illegal IR.  Notice that OpAccessChain
    // indexing is 0-based, so we should also reject index == size-of-array.
    return false;
  } else {
    const Instruction* var = replacements[static_cast<size_t>(indexValue)];
    if (chain->NumInOperands() > 2) {
      // Replace input access chain with another access chain.
      BasicBlock::iterator chainIter(chain);
      uint32_t replacementId = TakeNextId();
      if (replacementId == 0) {
        return false;
      }
      std::unique_ptr<Instruction> replacementChain(new Instruction(
          context(), chain->opcode(), chain->type_id(), replacementId,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
      // Add the remaining indexes.
      for (uint32_t i = 2; i < chain->NumInOperands(); ++i) {
        Operand copy(chain->GetInOperand(i));
        replacementChain->AddOperand(std::move(copy));
      }
      replacementChain->UpdateDebugInfoFrom(chain);
      auto iter = chainIter.InsertBefore(std::move(replacementChain));
      get_def_use_mgr()->AnalyzeInstDefUse(&*iter);
      context()->set_instr_block(&*iter, context()->get_instr_block(chain));
      context()->ReplaceAllUsesWith(chain->result_id(), replacementId);
    } else {
      // Replace with a use of the variable.
      context()->ReplaceAllUsesWith(chain->result_id(), var->result_id());
    }
  }

  return true;
}